

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O3

int Wln_RetRemoveOneFanout(Wln_Ret_t *p,int iObj)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  Wln_Ntk_t *pWVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if (-1 < iObj) {
    pWVar5 = p->pNtk;
    if (iObj < (pWVar5->vRefs).nSize) {
      iVar7 = -1;
      lVar9 = 0;
      while( true ) {
        if ((pWVar5->vRefs).pArray[(uint)iObj] <= lVar9) {
          return iVar7;
        }
        uVar6 = (p->vFanouts).nSize;
        if ((int)uVar6 <= iObj) break;
        piVar4 = (p->vFanouts).pArray;
        lVar8 = (long)piVar4[(uint)iObj];
        if ((lVar8 < 0) || (uVar6 <= (uint)piVar4[(uint)iObj])) {
LAB_00365ba7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar1 = piVar4[lVar8 + lVar9 * 2 + 1];
        if (((long)iVar1 < 0) || ((p->vFanins).nSize <= iVar1)) goto LAB_00365ba7;
        piVar3 = (p->vFanins).pArray;
        if (piVar3 == (int *)0x0) {
          return iVar7;
        }
        iVar2 = iVar7;
        if (piVar4[lVar8 + lVar9 * 2] != 0) {
          piVar3 = piVar3 + iVar1;
          if (*piVar3 == 0) {
            __assert_fail("pLink[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                          ,0x1bf,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
          }
          piVar4 = Wln_RetHeadToTail(p,piVar3);
          if ((*piVar4 < -1) || (uVar6 = *piVar4 + 1, (p->vEdgeLinks).nSize <= (int)uVar6)) break;
          iVar2 = (p->vEdgeLinks).pArray[uVar6];
          *piVar4 = 0;
          if (((long)iVar2 < 0) || (pWVar5 = p->pNtk, (pWVar5->vTypes).nSize <= iVar2)) break;
          if ((pWVar5->vTypes).pArray[iVar2] != 0x59) {
            __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                          ,0x1c3,"int Wln_RetRemoveOneFanout(Wln_Ret_t *, int)");
          }
          if (iVar7 != -1) {
            iVar2 = iVar7;
          }
        }
        iVar7 = iVar2;
        lVar9 = lVar9 + 1;
        if ((pWVar5->vRefs).nSize <= iObj) break;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Wln_RetRemoveOneFanout( Wln_Ret_t * p, int iObj )
{
    int k, iFanin, * pLink, iFlop, iFlop1 = -1;
    //int * pFanins  = Wln_RetFanins( p, iObj );
    Wln_RetForEachFanout( p, iObj, iFanin, pLink, k )
    {
        assert( pLink[0] );
        pLink = Wln_RetHeadToTail( p, pLink );
        iFlop = Vec_IntEntry( &p->vEdgeLinks, pLink[0] + 1 );
        pLink[0] = 0;
        assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
        if ( iFlop1 == -1 )
            iFlop1 = iFlop;
    }
    return iFlop1;
}